

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-glyph.c
# Opt level: O1

_Bool borg_flow_glyph(int why)

{
  uint8_t uVar1;
  byte bVar2;
  borg_grid *pbVar3;
  int iVar4;
  loc_conflict grid1;
  _Bool _Var5;
  wchar_t wVar6;
  loc_conflict grid2;
  char *what;
  wchar_t x;
  int iVar7;
  long lVar8;
  ulong uVar9;
  wchar_t wVar10;
  ulong uVar11;
  wchar_t y;
  int iVar12;
  int iVar13;
  borg_grid *ag_ptr [24];
  long alStack_f8 [25];
  
  y = borg.c.y;
  x = borg.c.x;
  if (glyph_y_center != '\0' || glyph_x_center != '\0') {
    grid2 = loc((uint)glyph_x_center,(uint)glyph_y_center);
    grid1.y = borg.c.y;
    grid1.x = borg.c.x;
    wVar6 = distance(grid1,grid2);
    if (wVar6 < L'2') goto LAB_002184b3;
  }
  borg_needs_new_sea = true;
LAB_002184b3:
  if ((borg.c.x == (uint)glyph_x) && (borg.c.y == (uint)glyph_y)) {
    glyph_x = '\0';
    glyph_y = '\0';
    if (borg_needs_new_sea == true) {
      glyph_y_center = (uint8_t)borg.c.y;
      glyph_x_center = (uint8_t)borg.c.x;
    }
    borg_needs_new_sea = false;
    what = format("# Glyph Creating at (%d,%d)");
    borg_note(what);
    _Var5 = borg_spell_fail(GLYPH_OF_WARDING,L'\x1e');
    if (((_Var5) || (_Var5 = borg_read_scroll(sv_scroll_rune_of_protection), _Var5)) ||
       (_Var5 = borg_activate_item(act_glyph), _Var5)) {
      if (0 < (long)track_glyph.num) {
        lVar8 = 0;
        do {
          if ((track_glyph.x[lVar8] == borg.c.x) && (track_glyph.y[lVar8] == borg.c.y)) {
            return false;
          }
          lVar8 = lVar8 + 1;
        } while (track_glyph.num != lVar8);
      }
      if (track_glyph.num < track_glyph.size) {
        borg_note("# Noting the creation of a glyph.");
        track_glyph.x[track_glyph.num] = borg.c.x;
        track_glyph.y[track_glyph.num] = borg.c.y;
        track_glyph.num = track_glyph.num + 1;
        return true;
      }
      return true;
    }
  }
  else {
    borg_flow_reverse(L'ú',true,false,false,L'\xffffffff',false);
    uVar9 = 0xf;
    iVar13 = -1;
    do {
      pbVar3 = borg_grids[uVar9];
      uVar11 = 0x32;
      do {
        uVar1 = pbVar3[uVar11].feat;
        if (((uVar1 == '\x01') || (pbVar3[uVar11].glyph == false)) &&
           (bVar2 = borg_data_cost->data[uVar9][uVar11], bVar2 < 0x4b)) {
          lVar8 = 0;
          do {
            wVar10 = (wchar_t)uVar11;
            wVar6 = (wchar_t)uVar9;
            alStack_f8[lVar8] =
                 (long)(borg_grids[borg_ddy_ddd[lVar8] + wVar6] + (borg_ddx_ddd[lVar8] + wVar10));
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x18);
          if ((borg_needs_new_sea & 1U) == 0) {
            iVar7 = 500 - (uint)bVar2;
            lVar8 = 0;
            do {
              if ((((int)borg_ddx_ddd[lVar8] + (uint)glyph_x_center == uVar11) &&
                  ((int)borg_ddy_ddd[lVar8] + (uint)glyph_y_center == uVar9)) &&
                 ((pbVar3[uVar11].glyph == false && (iVar13 <= iVar7)))) {
                x = wVar10;
                y = wVar6;
                iVar13 = iVar7;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x18);
          }
          else {
            lVar8 = 0;
            iVar7 = 0;
            do {
              if ((*(char *)alStack_f8[lVar8] == '\x01') ||
                 (((char *)alStack_f8[lVar8])[5] == '\x01')) {
                iVar7 = iVar7 + 1;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x18);
            if (iVar7 == 0x18) {
              lVar8 = 0;
              iVar7 = 0;
              do {
                iVar7 = iVar7 + (uint)*(byte *)(alStack_f8[lVar8] + 5);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 0x18);
              iVar12 = iVar7 * 500 - (uint)bVar2;
              iVar4 = iVar12 + 0xc1c;
              if (uVar1 != '\x01') {
                iVar4 = iVar12 + 100;
              }
              iVar12 = iVar4 + 5000;
              if ((iVar7 != 0x18) && (iVar12 = iVar4, pbVar3[uVar11].glyph != false)) {
                iVar12 = -1;
              }
              if ((0 < iVar12) && (iVar13 < 0 || iVar13 <= iVar12)) {
                x = wVar10;
                y = wVar6;
                iVar13 = iVar12;
              }
            }
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x94);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x33);
    wVar6 = (wchar_t)glyph_y_center;
    if (glyph_x_center != '\0' && (ulong)(uint)wVar6 != 0) {
      lVar8 = 0;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + (uint)borg_grids[(long)borg_ddy_ddd[lVar8] + (ulong)(uint)wVar6]
                              [(ulong)glyph_x_center + (long)borg_ddx_ddd[lVar8]].glyph;
        if (iVar7 == 0x18) {
          y = wVar6;
          x = (uint)glyph_x_center;
        }
        if (iVar7 == 0x18) {
          iVar13 = 5000;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x18);
    }
    borg_flow_clear();
    if (-1 < iVar13) {
      glyph_x = (uint8_t)x;
      glyph_y = (uint8_t)y;
      borg_flow_enqueue_grid(y,x);
      borg_flow_spread(L'ú',true,false,false,L'\xffffffff',false);
      _Var5 = borg_flow_commit("Glyph",L'\x03');
      if (_Var5) {
        _Var5 = borg_flow_old(L'\x03');
        return _Var5;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool borg_flow_glyph(int why)
{
    int i;
    int cost;

    int x, y;
    int v          = 0;

    int b_x        = borg.c.x;
    int b_y        = borg.c.y;
    int b_v        = -1;
    int goal_glyph = 0;
    int glyph      = 0;

    borg_grid *ag;

    if ((glyph_y_center == 0 && glyph_x_center == 0)
        || distance(borg.c, loc(glyph_x_center, glyph_y_center)) >= 50) {
        borg_needs_new_sea = true;
    }

    /* We have arrived */
    if ((glyph_x == borg.c.x) && (glyph_y == borg.c.y)) {
        /* Cancel */
        glyph_x = 0;
        glyph_y = 0;

        /* Store the center of the glyphs */
        if (borg_needs_new_sea) {
            glyph_y_center = borg.c.y;
            glyph_x_center = borg.c.x;
        }

        borg_needs_new_sea = false;

        /* Take note */
        borg_note(format("# Glyph Creating at (%d,%d)", borg.c.x, borg.c.y));

        /* Create the Glyph */
        if (borg_spell_fail(GLYPH_OF_WARDING, 30)
            || borg_read_scroll(sv_scroll_rune_of_protection)
            || borg_activate_item(act_glyph)) {
            /* Check for an existing glyph */
            for (i = 0; i < track_glyph.num; i++) {
                /* Stop if we already new about this glyph */
                if ((track_glyph.x[i] == borg.c.x)
                    && (track_glyph.y[i] == borg.c.y))
                    return false;
            }

            /* Track the newly discovered glyph */
            if (track_glyph.num < track_glyph.size) {
                borg_note("# Noting the creation of a glyph.");
                track_glyph.x[track_glyph.num] = borg.c.x;
                track_glyph.y[track_glyph.num] = borg.c.y;
                track_glyph.num++;
            }

            /* Success */
            return true;
        }

        /* Nope */
        return false;
    }

    /* Reverse flow */
    borg_flow_reverse(250, true, false, false, -1, false);

    /* Scan the entire map */
    for (y = 15; y < AUTO_MAX_Y - 15; y++) {
        for (x = 50; x < AUTO_MAX_X - 50; x++) {
            borg_grid *ag_ptr[24];

            int floor     = 0;
            int tmp_glyph = 0;

            /* Acquire the grid */
            ag = &borg_grids[y][x];

            /* Skip every non floor/glyph */
            if (ag->feat != FEAT_FLOOR && ag->glyph)
                continue;

            /* Acquire the cost */
            cost = borg_data_cost->data[y][x];

            /* Skip grids that are really far away.  He probably
             * won't be able to safely get there
             */
            if (cost >= 75)
                continue;

            /* Extract adjacent locations to each considered grid */
            for (i = 0; i < 24; i++) {
                /* Extract the location */
                int xx = x + borg_ddx_ddd[i];
                int yy = y + borg_ddy_ddd[i];

                /* Get the grid contents */
                ag_ptr[i] = &borg_grids[yy][xx];
            }

            /* Center Grid */
            if (borg_needs_new_sea) {
                goal_glyph = 24;

                /* Count Adjacent Flooors */
                for (i = 0; i < 24; i++) {
                    ag = ag_ptr[i];
                    if (ag->feat == FEAT_FLOOR || ag->glyph)
                        floor++;
                }

                /* Not a good location if not the center of the sea */
                if (floor != 24) {
                    continue;
                }

                /* Count floors already glyphed */
                for (i = 0; i < 24; i++) {
                    ag = ag_ptr[i];

                    /* Glyphs */
                    if (ag->glyph) {
                        tmp_glyph++;
                    }
                }

                /* Tweak -- Reward certain floors, punish distance */
                v = 100 + (tmp_glyph * 500) - (cost * 1);
                if (borg_grids[y][x].feat == FEAT_FLOOR)
                    v += 3000;

                /* If this grid is surrounded by glyphs, select it */
                if (tmp_glyph == goal_glyph)
                    v += 5000;

                /* If this grid is already glyphed but not
                 * surrounded by glyphs, then choose another.
                 */
                if (tmp_glyph != goal_glyph && borg_grids[y][x].glyph)
                    v = -1;

                /* The grid is not searchable */
                if (v <= 0)
                    continue;

                /* Track "best" grid */
                if ((b_v >= 0) && (v < b_v))
                    continue;

                /* Save the data */
                b_v = v;
                b_x = x;
                b_y = y;
            }
            /* old center, making outlying glyphs, */
            else {
                /* Count Adjacent Flooors */
                for (i = 0; i < 24; i++) {
                    /* Leave if this grid is not in good array */
                    if (glyph_x_center + borg_ddx_ddd[i] != x)
                        continue;
                    if (glyph_y_center + borg_ddy_ddd[i] != y)
                        continue;

                    /* Already got a glyph on it */
                    if (borg_grids[y][x].glyph)
                        continue;

                    /* Tweak -- Reward certain floors, punish distance */
                    v = 500 + (tmp_glyph * 500) - (cost * 1);

                    /* The grid is not searchable */
                    if (v <= 0)
                        continue;

                    /* Track "best" grid */
                    if ((b_v >= 0) && (v < b_v))
                        continue;

                    /* Save the data */
                    b_v = v;
                    b_x = x;
                    b_y = y;
                }
            }
        }
    }

    /* Extract adjacent locations to each considered grid */
    if (glyph_y_center != 0 && glyph_x_center != 0) {

        for (i = 0; i < 24; i++) {
            /* Extract the location */
            int xx = glyph_x_center + borg_ddx_ddd[i];
            int yy = glyph_y_center + borg_ddy_ddd[i];

            borg_grid *ag_ptr[24];

            /* Get the grid contents */
            ag_ptr[i] = &borg_grids[yy][xx];
            ag        = ag_ptr[i];

            /* If it is not a glyph, skip it */
            if (ag->glyph)
                glyph++;

            /* Save the data */
            if (glyph == 24) {
                b_v = 5000;
                b_x = glyph_x_center;
                b_y = glyph_y_center;
            }
        }
    }

    /* Clear the flow codes */
    borg_flow_clear();

    /* Hack -- Nothing found */
    if (b_v < 0)
        return false;

    /* Access grid */
    ag = &borg_grids[b_y][b_x];

    /* Memorize */
    glyph_x = b_x;
    glyph_y = b_y;

    /* Enqueue the grid */
    borg_flow_enqueue_grid(b_y, b_x);

    /* Spread the flow */
    borg_flow_spread(250, true, false, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("Glyph", GOAL_MISC))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_MISC))
        return false;

    /* Success */
    return true;
}